

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigcache.cpp
# Opt level: O2

void __thiscall
SignatureCache::ComputeEntryECDSA
          (SignatureCache *this,uint256 *entry,uint256 *hash,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,CPubKey *pubkey)

{
  long lVar1;
  uchar *data;
  CSHA256 *pCVar2;
  byte bVar3;
  long lVar4;
  size_t len;
  long in_FS_OFFSET;
  CSHA256 hasher;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = &hasher;
  for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pCVar2 = *(undefined8 *)(this->m_salted_hasher_ecdsa).s;
    this = (SignatureCache *)((this->m_salted_hasher_ecdsa).s + 2);
    pCVar2 = (CSHA256 *)((long)pCVar2 + 8);
  }
  pCVar2 = CSHA256::Write(&hasher,(uchar *)hash,0x20);
  if ((pubkey->vch[0] & 0xfe) == 2) {
    len = 0x21;
  }
  else {
    bVar3 = pubkey->vch[0] - 4;
    if (bVar3 < 4) {
      len = *(size_t *)(&DAT_00b5ace0 + (ulong)bVar3 * 8);
    }
    else {
      len = 0;
    }
  }
  pCVar2 = CSHA256::Write(pCVar2,pubkey->vch,len);
  data = (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pCVar2 = CSHA256::Write(pCVar2,data,
                          (long)(vchSig->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)data);
  CSHA256::Finalize(pCVar2,(uchar *)entry);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SignatureCache::ComputeEntryECDSA(uint256& entry, const uint256& hash, const std::vector<unsigned char>& vchSig, const CPubKey& pubkey) const
{
    CSHA256 hasher = m_salted_hasher_ecdsa;
    hasher.Write(hash.begin(), 32).Write(pubkey.data(), pubkey.size()).Write(vchSig.data(), vchSig.size()).Finalize(entry.begin());
}